

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O0

void __thiscall duckdb::TopNScanState::~TopNScanState(TopNScanState *this)

{
  SelectionVector::~SelectionVector((SelectionVector *)0x185aa8c);
  vector<unsigned_int,_true>::~vector((vector<unsigned_int,_true> *)0x185aa9a);
  return;
}

Assistant:

TopNScanState() : pos(0), sel(STANDARD_VECTOR_SIZE) {
	}